

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O1

int __thiscall
ncnn::Einsum::forward
          (Einsum *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  pointer pMVar4;
  pointer pbVar5;
  pointer pcVar6;
  Mat *pMVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  int iVar9;
  long lVar10;
  float *pfVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int s;
  long lVar15;
  ulong __new_size;
  size_t _elemsize;
  int iVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  float fVar21;
  vector<int,_std::allocator<int>_> dim_sizes;
  vector<int,_std::allocator<int>_> indexes;
  allocator_type local_91;
  ulong local_90;
  size_t local_88;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_48;
  Option *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  _elemsize = ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start)->elemsize;
  if (((this->lhs_tokens).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->lhs_tokens).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (iVar9 = std::__cxx11::string::compare((char *)&this->rhs_token), iVar9 == 0)) {
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar7,1,_elemsize,opt->blob_allocator);
    if ((float *)pMVar7->data == (float *)0x0) {
      return -100;
    }
    if ((long)pMVar7->c * pMVar7->cstep == 0) {
      return -100;
    }
    pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = (long)pMVar4->h;
    if (lVar10 < 1) {
      fVar21 = 0.0;
    }
    else {
      pfVar11 = (float *)pMVar4->data;
      fVar21 = 0.0;
      do {
        fVar21 = fVar21 + *pfVar11;
        pfVar11 = (float *)((long)pfVar11 + (long)pMVar4->w * pMVar4->elemsize + 4);
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    *(float *)pMVar7->data = fVar21;
    return 0;
  }
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(0x40);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + 0x10;
  lVar10 = 0;
  do {
    piVar1 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + lVar10;
    piVar1[0] = 1;
    piVar1[1] = 1;
    piVar1[2] = 1;
    piVar1[3] = 1;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x10);
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = 0;
  lVar10 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4;
  if (lVar10 != 0) {
    lVar10 = (lVar10 >> 3) * -0x71c71c71c71c71c7;
    pbVar5 = (this->lhs_tokens).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar14 = 0;
    do {
      iVar9 = pMVar4[lVar14].dims;
      if (0 < (long)iVar9) {
        pcVar6 = pbVar5[lVar14]._M_dataplus._M_p;
        lVar15 = 0;
        do {
          iVar12 = pMVar4[lVar14].w;
          iVar3 = pMVar4[lVar14].h;
          iVar17 = 1;
          if (iVar9 == 1) {
            iVar17 = iVar12;
          }
          iVar16 = iVar17;
          if (lVar15 == 0) {
            iVar16 = iVar3;
          }
          if (iVar9 != 2) {
            iVar16 = iVar17;
          }
          iVar17 = iVar16;
          if (lVar15 == 1) {
            iVar17 = iVar12;
          }
          if (iVar9 != 2) {
            iVar17 = iVar16;
          }
          iVar16 = iVar17;
          if (lVar15 == 0) {
            iVar16 = pMVar4[lVar14].c;
          }
          if (iVar9 != 3) {
            iVar16 = iVar17;
          }
          iVar17 = iVar16;
          if (lVar15 == 1) {
            iVar17 = iVar3;
          }
          if (iVar9 != 3) {
            iVar17 = iVar16;
          }
          iVar16 = iVar17;
          if (lVar15 == 2) {
            iVar16 = iVar12;
          }
          if (iVar9 != 3) {
            iVar16 = iVar17;
          }
          iVar17 = pMVar4[lVar14].c;
          if (lVar15 != 0) {
            iVar17 = iVar16;
          }
          if (iVar9 != 4) {
            iVar17 = iVar16;
          }
          iVar16 = iVar17;
          if (lVar15 == 1) {
            iVar16 = pMVar4[lVar14].d;
          }
          if (iVar9 == 4) {
            iVar17 = iVar16;
          }
          if (lVar15 != 2) {
            iVar3 = iVar17;
          }
          if (iVar9 != 4) {
            iVar3 = iVar17;
          }
          if (lVar15 != 3) {
            iVar12 = iVar3;
          }
          if (iVar9 != 4) {
            iVar12 = iVar3;
          }
          cVar2 = pcVar6[lVar15];
          uVar18 = (int)cVar2 - 0x68;
          uVar13 = (ulong)uVar18;
          if ((int)uVar18 < (int)__new_size) {
            uVar13 = __new_size;
          }
          __new_size = uVar13;
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)cVar2 + -0x69] = iVar12;
          lVar15 = lVar15 + 1;
        } while (iVar9 != lVar15);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar10 + (ulong)(lVar10 == 0));
  }
  local_88 = _elemsize;
  local_80 = bottom_blobs;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_48 = top_blobs;
  local_40 = opt;
  local_38 = &this->lhs_tokens;
  std::vector<int,_std::allocator<int>_>::resize(&local_78,__new_size);
  uVar18 = (uint)(this->rhs_token)._M_string_length;
  uVar13 = (ulong)uVar18;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__new_size,&local_91);
  local_90 = uVar13;
  switch(uVar18) {
  case 1:
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar7,*local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,_elemsize,opt->blob_allocator);
    pvVar8 = local_38;
    if (pMVar7->data == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)pMVar7->c * pMVar7->cstep == 0;
    }
    iVar9 = -100;
    if (bVar20) goto LAB_00544587;
    if (0 < pMVar7->w) {
      lVar10 = 0;
      do {
        *local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (int)lVar10;
        fVar21 = sum_dim(&local_78,1,bottom_blobs,pvVar8,&local_60);
        *(float *)((long)pMVar7->data + lVar10 * 4) = fVar21;
        lVar10 = lVar10 + 1;
      } while (lVar10 < pMVar7->w);
    }
    _elemsize = local_88;
    top_blobs = local_48;
    opt = local_40;
    if ((int)local_90 == 4) goto switchD_005440a1_caseD_4;
    if ((int)local_90 == 3) goto switchD_005440a1_caseD_3;
    if ((int)local_90 == 2) goto switchD_005440a1_caseD_2;
    break;
  case 2:
switchD_005440a1_caseD_2:
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar7,local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[1],
                *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,_elemsize,opt->blob_allocator);
    pvVar8 = local_38;
    if (pMVar7->data == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)pMVar7->c * pMVar7->cstep == 0;
    }
    iVar9 = -100;
    if (bVar20) goto LAB_00544587;
    if (0 < pMVar7->h) {
      lVar10 = 0;
      do {
        *local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (int)lVar10;
        if (0 < pMVar7->w) {
          lVar14 = 0;
          do {
            local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[1] = (int)lVar14;
            fVar21 = sum_dim(&local_78,2,local_80,pvVar8,&local_60);
            *(float *)((long)pMVar7->data + lVar14 * 4 + pMVar7->elemsize * lVar10 * (long)pMVar7->w
                      ) = fVar21;
            lVar14 = lVar14 + 1;
          } while (lVar14 < pMVar7->w);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pMVar7->h);
    }
    _elemsize = local_88;
    top_blobs = local_48;
    opt = local_40;
    if ((int)local_90 == 4) goto switchD_005440a1_caseD_4;
    if ((int)local_90 == 3) goto switchD_005440a1_caseD_3;
    break;
  case 3:
switchD_005440a1_caseD_3:
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar7,local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[2],
                local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[1],
                *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,_elemsize,opt->blob_allocator);
    pvVar8 = local_38;
    if (pMVar7->data == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)pMVar7->c * pMVar7->cstep == 0;
    }
    iVar9 = -100;
    if (bVar20) goto LAB_00544587;
    if (0 < pMVar7->c) {
      lVar10 = 0;
      do {
        *local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (int)lVar10;
        if (0 < pMVar7->h) {
          lVar14 = 0;
          do {
            local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[1] = (int)lVar14;
            if (0 < pMVar7->w) {
              lVar15 = 0;
              do {
                local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[2] = (int)lVar15;
                fVar21 = sum_dim(&local_78,3,local_80,pvVar8,&local_60);
                *(float *)((long)pMVar7->data +
                          lVar15 * 4 +
                          (pMVar7->w * lVar14 + pMVar7->cstep * lVar10) * pMVar7->elemsize) = fVar21
                ;
                lVar15 = lVar15 + 1;
              } while (lVar15 < pMVar7->w);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < pMVar7->h);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pMVar7->c);
    }
    iVar9 = -100;
    if (bVar20) goto LAB_00544587;
    _elemsize = local_88;
    top_blobs = local_48;
    opt = local_40;
    if ((int)local_90 == 4) goto switchD_005440a1_caseD_4;
    break;
  case 4:
switchD_005440a1_caseD_4:
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar7,local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[3],
                local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[2],
                local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[1],
                *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,_elemsize,opt->blob_allocator);
    if (pMVar7->data == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)pMVar7->c * pMVar7->cstep == 0;
    }
    iVar9 = -100;
    if (bVar20) goto LAB_00544587;
    local_88 = local_88 & 0xffffffffffffff00;
    if (0 < pMVar7->c) {
      lVar10 = 0;
      do {
        *local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (int)lVar10;
        if (0 < pMVar7->d) {
          lVar14 = 0;
          do {
            local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[1] = (int)lVar14;
            if (0 < pMVar7->h) {
              lVar15 = 0;
              do {
                local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[2] = (int)lVar15;
                if (0 < pMVar7->w) {
                  lVar19 = 0;
                  do {
                    local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[3] = (int)lVar19;
                    fVar21 = sum_dim(&local_78,4,local_80,local_38,&local_60);
                    *(float *)((long)pMVar7->data +
                              lVar19 * 4 +
                              ((pMVar7->h * lVar14 + lVar15) * (long)pMVar7->w +
                              pMVar7->cstep * lVar10) * pMVar7->elemsize) = fVar21;
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < pMVar7->w);
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < pMVar7->h);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < pMVar7->d);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pMVar7->c);
    }
    iVar9 = -100;
    if ((char)local_88 != '\0') goto LAB_00544587;
  }
  iVar9 = 0;
LAB_00544587:
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar9;
}

Assistant:

int Einsum::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // assert bottom_blobs.size() == lhs_tokens.size()
    // assert top_blobs.size() == 1

    size_t elemsize = bottom_blobs[0].elemsize;

    if (lhs_tokens.empty() && rhs_token == "ii")
    {
        // assert bottom_blobs.size() == 1
        // assert bottom_blob.dims == 2
        // assert bottom_blob.w == bottom_blob.h

        // trace
        Mat& top_blob = top_blobs[0];
        top_blob.create(1, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const Mat& bottom_blob = bottom_blobs[0];

        float sum = 0.f;

        for (int i = 0; i < bottom_blob.h; i++)
        {
            sum += bottom_blob.row(i)[i];
        }

        top_blob[0] = sum;

        return 0;
    }

    // resolve dimension sizes
    std::vector<int> dim_sizes(16, 1); // map ijklmnopqrstuvwx -> dim_size
    int dim_sizes_count = 0;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        const std::string& lhs_token = lhs_tokens[b];
        const Mat& bottom_blob = bottom_blobs[b];
        const int in_dims = bottom_blob.dims;

        for (int s = 0; s < in_dims; s++)
        {
            int dim_size = 1;
            if (in_dims == 1) dim_size = bottom_blob.w;
            if (in_dims == 2 && s == 0) dim_size = bottom_blob.h;
            if (in_dims == 2 && s == 1) dim_size = bottom_blob.w;
            if (in_dims == 3 && s == 0) dim_size = bottom_blob.c;
            if (in_dims == 3 && s == 1) dim_size = bottom_blob.h;
            if (in_dims == 3 && s == 2) dim_size = bottom_blob.w;
            if (in_dims == 4 && s == 0) dim_size = bottom_blob.c;
            if (in_dims == 4 && s == 1) dim_size = bottom_blob.d;
            if (in_dims == 4 && s == 2) dim_size = bottom_blob.h;
            if (in_dims == 4 && s == 3) dim_size = bottom_blob.w;

            int dim_sizes_index = lhs_token[s] - 'i';
            dim_sizes[dim_sizes_index] = dim_size;
            dim_sizes_count = std::max(dim_sizes_count, dim_sizes_index + 1);
        }
    }

    dim_sizes.resize(dim_sizes_count);

    const int out_dims = (int)rhs_token.size();

    std::vector<int> indexes(dim_sizes_count);

    if (out_dims == 1)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.w; i++)
        {
            indexes[0] = i;

            float sum = sum_dim(dim_sizes, 1, bottom_blobs, lhs_tokens, indexes);

            top_blob[i] = sum;
        }
    }

    if (out_dims == 2)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[1], dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.h; i++)
        {
            indexes[0] = i;

            for (int j = 0; j < top_blob.w; j++)
            {
                indexes[1] = j;

                float sum = sum_dim(dim_sizes, 2, bottom_blobs, lhs_tokens, indexes);

                top_blob.row(i)[j] = sum;
            }
        }
    }

    if (out_dims == 3)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[2], dim_sizes[1], dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.c; i++)
        {
            indexes[0] = i;

            for (int j = 0; j < top_blob.h; j++)
            {
                indexes[1] = j;

                for (int k = 0; k < top_blob.w; k++)
                {
                    indexes[2] = k;

                    float sum = sum_dim(dim_sizes, 3, bottom_blobs, lhs_tokens, indexes);

                    top_blob.channel(i).row(j)[k] = sum;
                }
            }
        }
    }

    if (out_dims == 4)
    {
        Mat& top_blob = top_blobs[0];
        top_blob.create(dim_sizes[3], dim_sizes[2], dim_sizes[1], dim_sizes[0], elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int i = 0; i < top_blob.c; i++)
        {
            indexes[0] = i;

            for (int j = 0; j < top_blob.d; j++)
            {
                indexes[1] = j;

                for (int k = 0; k < top_blob.h; k++)
                {
                    indexes[2] = k;

                    for (int l = 0; l < top_blob.w; l++)
                    {
                        indexes[3] = l;

                        float sum = sum_dim(dim_sizes, 4, bottom_blobs, lhs_tokens, indexes);

                        top_blob.channel(i).depth(j).row(k)[l] = sum;
                    }
                }
            }
        }
    }

    return 0;
}